

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::PeleLM(PeleLM *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *bl,
              DistributionMapping *dm,Real time)

{
  _Rb_tree_header *p_Var1;
  
  NavierStokesBase::NavierStokesBase(&this->super_NavierStokesBase,papa,lev,level_geom,bl,dm,time);
  (this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel = (_func_int **)&PTR__PeleLM_007129c8
  ;
  amrex::MultiFab::MultiFab(&this->external_sources);
  (this->raii_fbs).
  super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  .
  super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->raii_fbs).
  super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  .
  super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->raii_fbs).
  super_vector<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  .
  super__Vector_base<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>,_std::allocator<std::unique_ptr<FluxBoxes,_std::default_delete<FluxBoxes>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var1 = &(this->auxDiag)._M_t._M_impl.super__Rb_tree_header;
  (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->auxDiag)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (init_once_done == 0) {
    init_once();
  }
  if (NavierStokesBase::do_temp == 0) {
    amrex::Abort_host("do_temp MUST be true");
  }
  if (NavierStokesBase::have_divu == 0) {
    amrex::Abort_host("have_divu MUST be true");
  }
  if ((p_amb_old == -1.0) && (!NAN(p_amb_old))) {
    p_amb_old = prob_parm->P_mean;
  }
  if ((p_amb_new == -1.0) && (!NAN(p_amb_new))) {
    p_amb_new = prob_parm->P_mean;
  }
  this->updateFluxReg = false;
  define_data(this);
  return;
}

Assistant:

PeleLM::PeleLM (Amr&            papa,
                int             lev,
                const Geometry& level_geom,
                const BoxArray& bl,
                const DistributionMapping& dm,
                Real            time)
  :
  NavierStokesBase(papa,lev,level_geom,bl,dm,time)
{
  if (!init_once_done)
    init_once();

  if (!do_temp)
    amrex::Abort("do_temp MUST be true");

  if (!have_divu)
    amrex::Abort("have_divu MUST be true");

  // p_amb_old and p_amb_new contain the old-time and new-time
  // pressure at level 0.  For closed chamber problems they change over time.
  // set p_amb_old and new if they haven't been set yet
  // to the value in mod_Fvar_def.F90 set in PROB_F.F90
  // only the coarse level advance and the level 0-1 mac_sync
  // can modify these later
  if (p_amb_old == -1.0)
  {
    p_amb_old = prob_parm->P_mean;
  }
  if (p_amb_new == -1.0)
  {
    p_amb_new = prob_parm->P_mean;
  }

  updateFluxReg = false;

  define_data();
}